

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumMethods.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::EnumFirstLastMethod::~EnumFirstLastMethod(EnumFirstLastMethod *this)

{
  SystemSubroutine::~SystemSubroutine(&this->super_SystemSubroutine);
  operator_delete(this,0x40);
  return;
}

Assistant:

EnumFirstLastMethod(KnownSystemName knownNameId, bool first) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), first(first) {}